

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O1

int __thiscall
slang::SmallVectorBase<slang::ast::SystemTimingCheckSymbol::Arg>::copy
          (SmallVectorBase<slang::ast::SystemTimingCheckSymbol::Arg> *this,EVP_PKEY_CTX *dst,
          EVP_PKEY_CTX *src)

{
  undefined8 *puVar1;
  size_type sVar2;
  pointer pAVar3;
  size_t size;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  byte *pbVar7;
  long lVar8;
  bool bVar9;
  
  if (this->len == 0) {
    return 0;
  }
  size = this->len * 0x28;
  pbVar7 = (byte *)(*(long *)(*(long *)dst + 8) + 7U & 0xfffffffffffffff8);
  if (*(byte **)(dst + 8) < pbVar7 + size) {
    pbVar7 = BumpAllocator::allocateSlow((BumpAllocator *)dst,size,8);
  }
  else {
    *(byte **)(*(long *)dst + 8) = pbVar7 + size;
  }
  sVar2 = this->len;
  if (sVar2 != 0) {
    pAVar3 = this->data_;
    lVar8 = 0;
    do {
      *(undefined8 *)(pbVar7 + lVar8 + 0x20) =
           *(undefined8 *)((long)&(pAVar3->edgeDescriptors)._M_extent._M_extent_value + lVar8);
      puVar1 = (undefined8 *)((long)&pAVar3->expr + lVar8);
      uVar4 = *puVar1;
      uVar5 = puVar1[1];
      puVar1 = (undefined8 *)((long)&pAVar3->edge + lVar8);
      uVar6 = puVar1[1];
      *(undefined8 *)(pbVar7 + lVar8 + 0x10) = *puVar1;
      *(undefined8 *)(pbVar7 + lVar8 + 0x10 + 8) = uVar6;
      *(undefined8 *)(pbVar7 + lVar8) = uVar4;
      *(undefined8 *)(pbVar7 + lVar8 + 8) = uVar5;
      bVar9 = sVar2 * 0x28 + -0x28 == lVar8;
      if (bVar9) break;
      lVar8 = lVar8 + 0x28;
    } while (!bVar9);
  }
  return (int)pbVar7;
}

Assistant:

[[nodiscard]] std::span<T> copy(BumpAllocator& alloc) const {
        if (len == 0)
            return {};

        pointer dest = reinterpret_cast<pointer>(alloc.allocate(len * sizeof(T), alignof(T)));
        std::ranges::uninitialized_copy(begin(), end(), dest, dest + len);

        return std::span<T>(dest, len);
    }